

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::DelaySyntax::isKind(SyntaxKind kind)

{
  return kind == DelayControl || kind == CycleDelay;
}

Assistant:

bool DelaySyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::CycleDelay:
        case SyntaxKind::DelayControl:
            return true;
        default:
            return false;
    }
}